

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

void nni_stat_set_value(nni_stat_item *item,uint64_t v)

{
  if ((item->si_info->field_0x18 & 1) != 0) {
    nni_atomic_set64(&(item->si_u).sv_atomic,v);
    return;
  }
  (item->si_u).sv_number = v;
  return;
}

Assistant:

void
nni_stat_set_value(nni_stat_item *item, uint64_t v)
{
#ifdef NNG_ENABLE_STATS
	if (item->si_info->si_atomic) {
		nni_atomic_set64(&item->si_u.sv_atomic, v);
	} else {
		item->si_u.sv_number = v;
	}
#else
	NNI_ARG_UNUSED(item);
	NNI_ARG_UNUSED(v);
#endif
}